

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ctrl_t *pcVar1;
  char *pcVar2;
  FieldDescriptor *pFVar3;
  bool bVar4;
  uintptr_t v_3;
  slot_type *psVar5;
  size_t sVar6;
  uintptr_t v;
  ulong uVar7;
  size_t sVar8;
  byte bVar9;
  undefined8 uVar10;
  byte bVar11;
  ctrl_t cVar12;
  ulong uVar13;
  ulong uVar14;
  FindInfo FVar15;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                 );
  }
  sVar6 = common->capacity_;
  if (sVar6 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                 );
  }
  bVar11 = 0x80;
  if ((sVar6 == 1) &&
     (AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                  *)common), 1 < common->size_)) {
    psVar5 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)common);
    uVar7 = ((ulong)psVar5->first ^ 0x56e7c8) * -0x234dd359734ecb13;
    uVar7 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
              | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18
              | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)psVar5->first) *
            -0x234dd359734ecb13;
    uVar7 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
              | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18
              | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)psVar5->second) *
            -0x234dd359734ecb13;
    bVar11 = (byte)(((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)psVar5->second) *
                    0x5cb22ca68cb134ed >> 0x38) & 0x7f;
    bVar9 = 1;
  }
  else {
    bVar9 = 0;
  }
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar6 == 1;
  local_3e = bVar9;
  if (bVar9 == 0) {
    local_58.heap.control = (common->heap_or_soo_).heap.control;
    local_58.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
  }
  else {
    psVar5 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)common);
    sVar8 = common->capacity_;
    common->capacity_ = 0xffffffffffffff9c;
    local_58.heap.control = (ctrl_t *)psVar5->first;
    local_58.heap.slot_array = (MaybeInitializedPtr)psVar5->second;
    CommonFields::set_capacity(common,sVar8);
  }
  CommonFields::set_capacity(common,new_capacity);
  bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,16ul,false,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar11,0x10,0x10);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                 );
  }
  if ((bVar9 | sVar6 != 1) != 1) {
    return;
  }
  psVar5 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
                       *)common);
  if (bVar4) {
    if (sVar6 != 1) {
      HashSetResizeHelper::
      GrowSizeIntoSingleGroup<absl::lts_20250127::container_internal::hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,void>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                ((HashSetResizeHelper *)&local_58.heap,common,
                 (allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
                  *)common);
LAB_002b67c4:
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x10);
      return;
    }
    sVar6 = common->capacity_;
    common->capacity_ = 0xffffffffffffff9c;
    psVar5[1].first = (Message *)local_58.heap.control;
    psVar5[1].second = (FieldDescriptor *)local_58.heap.slot_array;
  }
  else {
    if (sVar6 != 1) {
      if (local_3f == '\x01') {
        __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x7ea,
                      "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
      }
      if (local_48 != 0) {
        sVar8 = 0;
        sVar6 = local_48;
        uVar10 = local_58.heap.slot_array;
        do {
          if (local_3f == '\x01') {
            __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7e6,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (kSentinel < local_58.heap.control[sVar8]) {
            pcVar2 = ((DescriptorNames *)(uVar10 + 8))->payload_;
            uVar7 = (*(ulong *)uVar10 ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                    -0x234dd359734ecb13;
            uVar7 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ *(ulong *)uVar10) *
                    -0x234dd359734ecb13;
            uVar7 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                      (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                      (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                      (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)pcVar2) *
                    -0x234dd359734ecb13;
            uVar14 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                       (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                       (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                       (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)pcVar2) *
                     -0x234dd359734ecb13;
            FVar15 = find_first_non_full<void>
                               (common,uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
                                       (uVar14 & 0xff0000000000) >> 0x18 |
                                       (uVar14 & 0xff00000000) >> 8 | (uVar14 & 0xff000000) << 8 |
                                       (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
                                       uVar14 << 0x38);
            uVar13 = FVar15.offset;
            uVar7 = common->capacity_;
            if (uVar7 <= uVar13) goto LAB_002b6806;
            cVar12 = (ctrl_t)(uVar14 >> 0x38) & ~kEmpty;
            pcVar1 = (common->heap_or_soo_).heap.control;
            pcVar1[uVar13] = cVar12;
            pcVar1[(ulong)((uint)uVar7 & 0xf) + (uVar13 - 0xf & uVar7)] = cVar12;
            common->capacity_ = 0xffffffffffffff9c;
            pFVar3 = (FieldDescriptor *)((DescriptorNames *)(uVar10 + 8))->payload_;
            psVar5[uVar13].first = *(Message **)uVar10;
            psVar5[uVar13].second = pFVar3;
            CommonFields::set_capacity(common,uVar7);
            sVar6 = local_48;
          }
          sVar8 = sVar8 + 1;
          uVar10 = uVar10 + 0x10;
        } while (sVar8 != sVar6);
      }
      if ((common->size_ & 1) != 0) {
        CommonFields::backing_array_start(common);
      }
      goto LAB_002b67c4;
    }
    uVar7 = ((ulong)local_58.heap.control ^ 0x56e7c8) * -0x234dd359734ecb13;
    uVar7 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
              | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18
              | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)local_58.heap.control) *
            -0x234dd359734ecb13;
    uVar7 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
              | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18
              | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)local_58.heap.slot_array) *
            -0x234dd359734ecb13;
    uVar13 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18
               | (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 |
               (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^
             (ulong)local_58.heap.slot_array) * -0x234dd359734ecb13;
    FVar15 = find_first_non_full<void>
                       (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                               (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
                               (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                               (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38);
    uVar7 = FVar15.offset;
    sVar6 = common->capacity_;
    if (sVar6 <= uVar7) {
LAB_002b6806:
      __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0x744,
                    "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                   );
    }
    cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
    pcVar1 = (common->heap_or_soo_).heap.control;
    pcVar1[uVar7] = cVar12;
    pcVar1[(ulong)((uint)sVar6 & 0xf) + (uVar7 - 0xf & sVar6)] = cVar12;
    common->capacity_ = 0xffffffffffffff9c;
    psVar5[uVar7].first = (Message *)local_58.heap.control;
    psVar5[uVar7].second = (FieldDescriptor *)local_58.heap.slot_array;
  }
  CommonFields::set_capacity(common,sVar6);
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }